

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

double __thiscall CppMLNN::loss(CppMLNN *this,MatrixXd *y_predict,MatrixXd *labels)

{
  Scalar SVar1;
  undefined1 local_78 [8];
  MatrixXd entropy;
  Matrix<double,__1,__1,_0,__1,__1> local_50;
  undefined1 local_38 [8];
  MatrixXd probs;
  MatrixXd *labels_local;
  MatrixXd *y_predict_local;
  CppMLNN *this_local;
  
  probs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)labels;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_50,y_predict);
  softmax((MatrixXd *)local_38,this,&local_50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_50);
  cross_entropy((MatrixXd *)local_78,this,(MatrixXd *)local_38,
                (MatrixXd *)
                probs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
  SVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_78);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_78);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  return SVar1;
}

Assistant:

double CppMLNN::loss(const MatrixXd &y_predict, const MatrixXd &labels) {
	MatrixXd probs = softmax(y_predict);
	MatrixXd entropy = cross_entropy(probs, labels);

	return entropy.mean();
}